

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.cpp
# Opt level: O0

void line_x_validate(Am_Web_Events *events)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Am_Slot_Key AVar4;
  int iVar5;
  Am_Value *pAVar6;
  ostream *poVar7;
  char *pcVar8;
  int local_64;
  int local_60;
  int wh_adjustment;
  int rb_adjustment;
  int lt_adjustment;
  Am_Style ls;
  int local_48;
  int width;
  int left;
  int x2;
  int x1;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object self;
  Am_Slot slot;
  bool leftwidth_changed;
  bool x1x2_changed;
  Am_Web_Events *events_local;
  
  bVar1 = false;
  bVar2 = false;
  Am_Web_Events::Start(events);
  self.data = (Am_Object_Data *)Am_Web_Events::Get(events);
  Am_Slot::Get_Owner((Am_Slot *)&local_30);
  Am_Object::Am_Object(&local_28,&local_30);
  Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&local_30);
  pAVar6 = Am_Object::Get(&local_28,0x8b,0);
  left = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(&local_28,0x8d,0);
  width = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(&local_28,100,0);
  local_48 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(&local_28,0x66,0);
  ls.data._4_4_ = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(&local_28,0x6b,0);
  Am_Style::Am_Style((Am_Style *)&rb_adjustment,pAVar6);
  get_thickness_adjustments((Am_Style *)&rb_adjustment,&wh_adjustment,&local_60,&local_64);
  while (bVar3 = Am_Web_Events::Last(events), ((bVar3 ^ 0xffU) & 1) != 0) {
    self.data = (Am_Object_Data *)Am_Web_Events::Get(events);
    AVar4 = Am_Slot::Get_Key((Am_Slot *)&self);
    switch(AVar4) {
    case 100:
    case 0x66:
      if (left < width) {
        left = local_48 + wh_adjustment;
        width = (local_48 + ls.data._4_4_) - local_60;
      }
      else {
        left = (local_48 + ls.data._4_4_) - local_60;
        width = local_48 + wh_adjustment;
      }
      bVar1 = true;
      break;
    default:
      poVar7 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar7 = std::operator<<(poVar7,"** Bug: unexpected slot in line_x_validate: ");
      AVar4 = Am_Slot::Get_Key((Am_Slot *)&self);
      pcVar8 = Am_Get_Slot_Name(AVar4);
      poVar7 = std::operator<<(poVar7,pcVar8);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      Am_Error();
    case 0x6b:
      break;
    case 0x8b:
    case 0x8d:
      local_48 = imin(left,width);
      local_48 = local_48 - wh_adjustment;
      iVar5 = iabs(width - left);
      ls.data._4_4_ = iVar5 + local_64;
      bVar2 = true;
    }
    Am_Web_Events::Next(events);
  }
  if (bVar1) {
    Am_Object::Set(&local_28,0x8b,left,0);
    Am_Object::Set(&local_28,0x8d,width,0);
  }
  if (bVar2) {
    Am_Object::Set(&local_28,100,local_48,0);
    Am_Object::Set(&local_28,0x66,ls.data._4_4_,0);
  }
  Am_Style::~Am_Style((Am_Style *)&rb_adjustment);
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

void
line_x_validate(Am_Web_Events &events)
{
  bool x1x2_changed = false;
  bool leftwidth_changed = false;

  events.Start();
  Am_Slot slot = events.Get();
  Am_Object self = slot.Get_Owner();
  int x1 = self.Get(Am_X1);
  int x2 = self.Get(Am_X2);
  int left = self.Get(Am_LEFT);
  int width = self.Get(Am_WIDTH);
  Am_Style ls = self.Get(Am_LINE_STYLE);
  int lt_adjustment, rb_adjustment, wh_adjustment;
  get_thickness_adjustments(ls, lt_adjustment, rb_adjustment, wh_adjustment);
  while (!events.Last()) {
    slot = events.Get();
    //std::cout << "__Line_x_Web " << self << " slot " << slot.Get_Key ()
    //  << " l,w,x1,x2 " << left << " " << width << " " << x1 << " " << x2
    //	 <<std::endl <<std::flush;
    switch (slot.Get_Key()) {
    case Am_X1:
    case Am_X2:
      left = imin(x1, x2) - lt_adjustment;
      width = iabs(x2 - x1) + wh_adjustment;
      leftwidth_changed = true;
      //std::cout << "__  left " << left << " width " << width <<std::endl <<std::flush;
      break;
    case Am_LEFT:
    case Am_WIDTH:
      if (x1 < x2) {
        x1 = left + lt_adjustment;
        x2 = left + width - rb_adjustment;
      } else {
        x1 = left + width - rb_adjustment;
        x2 = left + lt_adjustment;
      }
      x1x2_changed = true;
      //std::cout << "__  x1 " << x1 << " x2 " << x2 <<std::endl <<std::flush;
      break;
    case Am_LINE_STYLE:
      break;
    default:
      Am_ERROR("** Bug: unexpected slot in line_x_validate: "
               << Am_Get_Slot_Name(slot.Get_Key()));
    }
    events.Next();
  }

  if (x1x2_changed) {
    self.Set(Am_X1, x1);
    self.Set(Am_X2, x2);
  }

  if (leftwidth_changed) {
    self.Set(Am_LEFT, left);
    self.Set(Am_WIDTH, width);
  }
}